

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::SetInitialBlock
          (ThreadSafeArena *this,void *mem,size_t size)

{
  long lVar1;
  SerialArena *pSVar2;
  void *in_RCX;
  long *in_FS_OFFSET;
  Memory mem_00;
  
  lVar1 = *in_FS_OFFSET;
  mem_00.size = lVar1 - 0x40;
  mem_00.ptr = (void *)size;
  pSVar2 = SerialArena::New((SerialArena *)mem,mem_00,in_RCX);
  pSVar2->next_ = (SerialArena *)0x0;
  *(SerialArena **)(this + 0x10) = pSVar2;
  *(SerialArena **)(lVar1 + -0x30) = pSVar2;
  *(undefined8 *)(lVar1 + -0x38) = *(undefined8 *)this;
  *(SerialArena **)(this + 0x18) = pSVar2;
  return;
}

Assistant:

void ThreadSafeArena::SetInitialBlock(void* mem, size_t size) {
  SerialArena* serial = SerialArena::New({mem, size}, &thread_cache());
  serial->set_next(NULL);
  threads_.store(serial, std::memory_order_relaxed);
  CacheSerialArena(serial);
}